

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int level)

{
  int *piVar1;
  int iVar2;
  lbool *plVar3;
  byte *pbVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (level < (this->trail_lim).sz) {
    lVar7 = (long)(this->trail).sz;
    while( true ) {
      lVar6 = lVar7 + -1;
      piVar1 = (this->trail_lim).data;
      iVar5 = piVar1[level];
      if (lVar7 <= iVar5) break;
      iVar5 = (this->trail).data[lVar6].x >> 1;
      plVar3 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->assigns).
                           super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,iVar5);
      plVar3->value = l_Undef;
      if ((1 < this->phase_saving) ||
         ((this->phase_saving == 1 &&
          ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar6)))) {
        iVar2 = (this->trail).data[lVar6].x;
        pbVar4 = (byte *)IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                   (&(this->polarity).
                                     super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar5);
        *pbVar4 = (byte)iVar2 & 1;
      }
      insertVarOrder(this,iVar5);
      lVar7 = lVar6;
    }
    this->qhead = iVar5;
    vec<Minisat::Lit,_int>::shrink(&this->trail,(this->trail).sz - piVar1[level]);
    vec<int,_int>::shrink(&this->trail_lim,(this->trail_lim).sz - level);
    return;
  }
  return;
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || (phase_saving == 1 && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } }